

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

bool GUIComponentParse(uint32_t line_number,string *gui_component_line,string *uniform_line,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *previous_components,
                      GUIComponent *out_component,string *out_parse_error)

{
  pointer pGVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  EGUIUniformType EVar9;
  uint uVar10;
  string *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  GUIComponent *previous_component;
  ulong uVar12;
  pointer pGVar13;
  EGUIComponentType EVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  string uniform_type;
  anon_class_16_2_f93b81b2 ReportError;
  string component_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  string component_data;
  uint32_t line_number_local;
  
  psVar11 = &bStack_108;
  ReportError.line_number = &line_number_local;
  ReportError.out_parse_error = out_parse_error;
  line_number_local = line_number;
  if (uniform_line->_M_string_length == 0) {
    std::operator+(&component_data,"GUI type not associated with any uniform \'",gui_component_line)
    ;
    std::operator+(&component_name,&component_data,"\'");
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&component_name);
    std::__cxx11::string::~string((string *)&component_name);
    std::__cxx11::string::~string((string *)&component_data);
    return false;
  }
  uVar10 = 0;
  do {
    uVar12 = (ulong)uVar10;
    if (gui_component_line->_M_string_length <= uVar12) break;
    uVar10 = uVar10 + 1;
  } while ((gui_component_line->_M_dataplus)._M_p[uVar12] != '(');
  EVar14 = EGUIComponentTypeSlider1;
  std::__cxx11::string::substr((ulong)&component_name,(ulong)gui_component_line);
  std::__cxx11::string::substr((ulong)&component_data,(ulong)gui_component_line);
  bVar3 = std::operator==(&component_name,"slider1");
  bVar4 = true;
  if (!bVar3) {
    bVar3 = std::operator==(&component_name,"slider2");
    if (bVar3) {
      EVar14 = EGUIComponentTypeSlider2;
      goto LAB_0011622c;
    }
    bVar3 = std::operator==(&component_name,"slider3");
    if (bVar3) {
      EVar14 = EGUIComponentTypeSlider3;
      goto LAB_0011622c;
    }
    bVar3 = std::operator==(&component_name,"slider4");
    if (bVar3) {
      EVar14 = EGUIComponentTypeSlider4;
      goto LAB_0011622c;
    }
    bVar4 = std::operator==(&component_name,"color3");
    if (bVar4) {
      EVar14 = EGUIComponentTypeColor3;
LAB_00116472:
      bVar4 = false;
      goto LAB_0011622c;
    }
    bVar4 = std::operator==(&component_name,"color4");
    if (bVar4) {
      EVar14 = EGUIComponentTypeColor4;
      goto LAB_00116472;
    }
    std::operator+(&bStack_108,"Invalid GUI type name \'",&component_name);
    std::operator+(&uniform_type,&bStack_108,"\'");
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&uniform_type);
    std::__cxx11::string::~string((string *)&uniform_type);
LAB_00116328:
    std::__cxx11::string::~string((string *)psVar11);
    bVar4 = false;
    goto LAB_0011656b;
  }
LAB_0011622c:
  this = &bStack_108;
  out_component->Type = EVar14;
  if (component_data._M_string_length == 0) {
    if (bVar4) {
      out_component->field_4 = (anon_union_8_1_70c8c71c_for_GUIComponent_4)0x3f80000000000000;
    }
  }
  else if ((bVar4) &&
          (iVar6 = __isoc99_sscanf(component_data._M_dataplus._M_p,"(%f, %f)",
                                   &out_component->field_4), iVar6 != 2)) {
    uniform_type._M_dataplus._M_p = (pointer)&uniform_type.field_2;
    uniform_type._M_string_length = 0;
    uniform_type.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_98,"Invalid format for GUI component data \'",&component_data);
    std::operator+(&bStack_108,&local_98,"\'\n");
    std::__cxx11::string::append((string *)&uniform_type);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,"Format should be @",&component_name);
    std::operator+(&bStack_108,&local_98,"(start_range, end_range)");
    std::__cxx11::string::append((string *)&uniform_type);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_98);
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&uniform_type);
    psVar11 = &uniform_type;
    goto LAB_00116328;
  }
  SplitString(&uniform_tokens,uniform_line,' ');
  if ((long)uniform_tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)uniform_tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    bVar4 = std::operator!=(uniform_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"uniform");
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uniform_type,"GUI type not associated with a uniform",
                 (allocator<char> *)&bStack_108);
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&uniform_type);
      goto LAB_001163ca;
    }
    std::__cxx11::string::string
              ((string *)&uniform_type,
               (string *)
               (uniform_tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1));
    bVar4 = std::operator==(&uniform_type,"float");
    EVar9 = EGUIUniformTypeFloat;
    if (bVar4) {
LAB_00116497:
      out_component->UniformType = EVar9;
      uVar7 = GUIComponents(out_component->Type);
      uVar8 = GUIUniformVariableComponents(out_component->UniformType);
      if (uVar7 != uVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_108,
                   "GUI component count does not match uniform component count",
                   (allocator<char> *)&local_98);
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&bStack_108);
        goto LAB_0011654d;
      }
      while (uniform_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p
             [uniform_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length - 1] == ';') {
        std::__cxx11::string::pop_back();
      }
      psVar11 = &out_component->UniformName;
      std::__cxx11::string::_M_assign((string *)psVar11);
      bVar4 = std::operator==(psVar11,"time");
      if ((bVar4) || (bVar4 = std::operator==(psVar11,"resolution"), bVar4)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_108,"GUI type not allowed for builtin uniforms",
                   (allocator<char> *)&local_98);
        GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&bStack_108);
        this = &bStack_108;
        goto LAB_0011654d;
      }
      pGVar1 = (previous_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pGVar13 = (previous_components->
                     super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
                     super__Vector_impl_data._M_start; pGVar13 != pGVar1; pGVar13 = pGVar13 + 1) {
        _Var5 = std::operator==(&pGVar13->UniformName,psVar11);
        if (_Var5) {
          uVar2 = *(undefined8 *)(pGVar13->Data + 2);
          *(undefined8 *)out_component->Data = *(undefined8 *)pGVar13->Data;
          *(undefined8 *)(out_component->Data + 2) = uVar2;
        }
      }
      bVar4 = true;
    }
    else {
      bVar4 = std::operator==(&uniform_type,"vec2");
      if (bVar4) {
        EVar9 = EGUIUniformTypeVec2;
        goto LAB_00116497;
      }
      bVar4 = std::operator==(&uniform_type,"vec3");
      if (bVar4) {
        EVar9 = EGUIUniformTypeVec3;
        goto LAB_00116497;
      }
      bVar4 = std::operator==(&uniform_type,"vec4");
      if (bVar4) {
        EVar9 = EGUIUniformTypeVec4;
        goto LAB_00116497;
      }
      std::operator+(&local_98,"GUI not supported for uniform type \'",&uniform_type);
      std::operator+(&bStack_108,&local_98,"\'");
      GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&bStack_108);
      std::__cxx11::string::~string((string *)&bStack_108);
      this = &local_98;
LAB_0011654d:
      std::__cxx11::string::~string((string *)this);
      bVar4 = false;
    }
    std::__cxx11::string::~string((string *)&uniform_type);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniform_type,"GUI associated with invalid uniform",
               (allocator<char> *)&bStack_108);
    GUIComponentParse::anon_class_16_2_f93b81b2::operator()(&ReportError,&uniform_type);
LAB_001163ca:
    std::__cxx11::string::~string((string *)&uniform_type);
    bVar4 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&uniform_tokens);
LAB_0011656b:
  std::__cxx11::string::~string((string *)&component_data);
  std::__cxx11::string::~string((string *)&component_name);
  return bVar4;
}

Assistant:

bool GUIComponentParse(uint32_t line_number, const std::string& gui_component_line, const std::string& uniform_line, const std::vector<GUIComponent>& previous_components, GUIComponent& out_component, std::string& out_parse_error) {
    auto ReportError = [&](const std::string& error) {
        out_parse_error = error + " at line " + std::to_string(line_number);
    };
    if (uniform_line.empty()) {
        ReportError("GUI type not associated with any uniform '" + gui_component_line + "'");
        return false;
    }
    uint32_t current_char = 0;
    while (current_char < gui_component_line.size() && gui_component_line[current_char] != '(') {
        ++current_char;
    }

    std::string component_name = gui_component_line.substr(0, current_char);
    std::string component_data = gui_component_line.substr(current_char, std::string::npos);
    if (component_name == "slider1") {
        out_component.Type = EGUIComponentTypeSlider1;
    } else if (component_name == "slider2") {
        out_component.Type = EGUIComponentTypeSlider2;
    } else if (component_name == "slider3") {
        out_component.Type = EGUIComponentTypeSlider3;
    } else if (component_name == "slider4") {
        out_component.Type = EGUIComponentTypeSlider4;
    } else if (component_name == "color3") {
        out_component.Type = EGUIComponentTypeColor3;
    } else if (component_name == "color4") {
        out_component.Type = EGUIComponentTypeColor4;
    } else {
        ReportError("Invalid GUI type name '" + component_name + "'");
        return false;
    }

    if (!component_data.empty()) {
        if (GUIIsSliderType(out_component.Type)) {
            int scanned = sscanf(component_data.c_str(), "(%f, %f)",
                &out_component.SliderRange.Start,
                &out_component.SliderRange.End);
            if (scanned != 2) {
                std::string error;
                error += "Invalid format for GUI component data '" + component_data + "'\n";
                error += "Format should be @" + component_name + "(start_range, end_range)";
                ReportError(error);
                return false;
            }
        }
    } else {
        // Initialize the data with convenient defaults
        if (GUIIsSliderType(out_component.Type)) {
            out_component.SliderRange.Start = 0.0f;
            out_component.SliderRange.End = 1.0f;
        }
    }

    std::vector<std::string> uniform_tokens = SplitString(uniform_line,  ' ');
    if (uniform_tokens.size() != 3) {
        ReportError("GUI associated with invalid uniform");
        return false;
    }

    if (uniform_tokens[0] != "uniform") {
        ReportError("GUI type not associated with a uniform");
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type == "float") {
        out_component.UniformType = EGUIUniformTypeFloat;
    } else if (uniform_type == "vec2") {
        out_component.UniformType = EGUIUniformTypeVec2;
    } else if (uniform_type == "vec3") {
        out_component.UniformType = EGUIUniformTypeVec3;
    } else if (uniform_type == "vec4") {
        out_component.UniformType = EGUIUniformTypeVec4;
    } else {
        ReportError("GUI not supported for uniform type '" + uniform_type + "'");
        return false;
    }

    if (GUIComponents(out_component.Type) != GUIUniformVariableComponents(out_component.UniformType)) {
        ReportError("GUI component count does not match uniform component count");
        return false;
    }

    // Trim semicolon ';'
    while (uniform_tokens.back().back() == ';') {
        uniform_tokens.back().pop_back();
    }

    out_component.UniformName = uniform_tokens.back();

    if (out_component.UniformName == "time" || out_component.UniformName == "resolution") {
        ReportError("GUI type not allowed for builtin uniforms");
        return false;
    }

    for (const GUIComponent& previous_component : previous_components) {
        if (previous_component.UniformName == out_component.UniformName) {
            memcpy(&out_component.Data, &previous_component.Data, sizeof(out_component.Data));
        }
    }
    return true;
}